

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O3

void __thiscall Assimp::glTF2Importer::ImportAnimations(glTF2Importer *this,Asset *r)

{
  _Hash_node_base *p_Var1;
  aiScene *paVar2;
  Animation *anim;
  uint uVar3;
  aiAnimation **ppaVar4;
  pointer ppAVar5;
  aiAnimation *paVar6;
  aiNodeAnim **ppaVar7;
  aiNodeAnim *paVar8;
  aiMeshMorphAnim **ppaVar9;
  aiMeshMorphAnim *paVar10;
  __node_base _Var11;
  ulong uVar12;
  uint uVar13;
  Asset *pAVar14;
  iterator __begin3;
  __node_base _Var15;
  ulong uVar16;
  int iVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
  samplers;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_AnimationSamplers>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if ((r->scene).vector != (vector<glTF2::Scene_*,_std::allocator<glTF2::Scene_*>_> *)0x0) {
    this->mScene->mNumAnimations =
         (uint)((ulong)((long)(r->animations).mObjs.
                              super__Vector_base<glTF2::Animation_*,_std::allocator<glTF2::Animation_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(r->animations).mObjs.
                             super__Vector_base<glTF2::Animation_*,_std::allocator<glTF2::Animation_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
    paVar2 = this->mScene;
    uVar16 = (ulong)paVar2->mNumAnimations;
    if (uVar16 != 0) {
      ppaVar4 = (aiAnimation **)operator_new__(uVar16 << 3);
      paVar2->mAnimations = ppaVar4;
      ppAVar5 = (r->animations).mObjs.
                super__Vector_base<glTF2::Animation_*,_std::allocator<glTF2::Animation_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(r->animations).mObjs.
                              super__Vector_base<glTF2::Animation_*,_std::allocator<glTF2::Animation_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar5) >> 3) != 0
         ) {
        uVar16 = 0;
        do {
          anim = ppAVar5[uVar16];
          paVar6 = (aiAnimation *)operator_new(0x448);
          (paVar6->mName).length = 0;
          (paVar6->mName).data[0] = '\0';
          memset((paVar6->mName).data + 1,0x1b,0x3ff);
          paVar6->mDuration = -1.0;
          paVar6->mTicksPerSecond = 0.0;
          paVar6->mNumChannels = 0;
          paVar6->mChannels = (aiNodeAnim **)0x0;
          paVar6->mNumMeshChannels = 0;
          paVar6->mMeshChannels = (aiMeshAnim **)0x0;
          paVar6->mNumMorphMeshChannels = 0;
          paVar6->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
          uVar12 = (anim->super_Object).name._M_string_length;
          if (uVar12 < 0x400) {
            (paVar6->mName).length = (ai_uint32)uVar12;
            memcpy((paVar6->mName).data,(anim->super_Object).name._M_dataplus._M_p,uVar12);
            (paVar6->mName).data[uVar12] = '\0';
          }
          paVar6->mDuration = 0.0;
          paVar6->mTicksPerSecond = 0.0;
          GatherSamplers((unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                          *)&local_68,anim);
          _Var15._M_nxt = local_68._M_before_begin._M_nxt;
          if (local_68._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
            paVar6->mNumChannels = 0;
            paVar6->mNumMorphMeshChannels = 0;
            dVar18 = 0.0;
          }
          else {
            uVar3 = 0;
            uVar13 = 0;
            _Var11._M_nxt = local_68._M_before_begin._M_nxt;
            do {
              uVar3 = uVar3 + ((_Var11._M_nxt[4]._M_nxt != (_Hash_node_base *)0x0 ||
                               _Var11._M_nxt[3]._M_nxt != (_Hash_node_base *)0x0) ||
                              _Var11._M_nxt[2]._M_nxt != (_Hash_node_base *)0x0);
              p_Var1 = _Var11._M_nxt + 5;
              _Var11._M_nxt = (_Var11._M_nxt)->_M_nxt;
              uVar13 = (uVar13 + 1) - (uint)(p_Var1->_M_nxt == (_Hash_node_base *)0x0);
            } while (_Var11._M_nxt != (_Hash_node_base *)0x0);
            paVar6->mNumChannels = uVar3;
            if (uVar3 != 0) {
              pAVar14 = (Asset *)((ulong)uVar3 << 3);
              ppaVar7 = (aiNodeAnim **)operator_new__((ulong)pAVar14);
              paVar6->mChannels = ppaVar7;
              if (_Var15._M_nxt != (_Hash_node_base *)0x0) {
                iVar17 = 0;
                do {
                  if (((_Var15._M_nxt[3]._M_nxt != (_Hash_node_base *)0x0) ||
                      (_Var15._M_nxt[4]._M_nxt != (_Hash_node_base *)0x0)) ||
                     (_Var15._M_nxt[2]._M_nxt != (_Hash_node_base *)0x0)) {
                    paVar8 = CreateNodeAnim(pAVar14,(r->nodes).mObjs.
                                                                                                        
                                                  super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [*(uint *)&_Var15._M_nxt[1]._M_nxt],
                                            (AnimationSamplers *)(_Var15._M_nxt + 2));
                    paVar6->mChannels[iVar17] = paVar8;
                    iVar17 = iVar17 + 1;
                  }
                  _Var15._M_nxt = (_Var15._M_nxt)->_M_nxt;
                } while (_Var15._M_nxt != (_Hash_node_base *)0x0);
              }
            }
            paVar6->mNumMorphMeshChannels = uVar13;
            if (uVar13 != 0) {
              pAVar14 = (Asset *)((ulong)uVar13 << 3);
              ppaVar9 = (aiMeshMorphAnim **)operator_new__((ulong)pAVar14);
              paVar6->mMorphMeshChannels = ppaVar9;
              if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
                iVar17 = 0;
                _Var15._M_nxt = local_68._M_before_begin._M_nxt;
                do {
                  if (_Var15._M_nxt[5]._M_nxt != (_Hash_node_base *)0x0) {
                    paVar10 = CreateMeshMorphAnim(pAVar14,(r->nodes).mObjs.
                                                                                                                    
                                                  super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [*(uint *)&_Var15._M_nxt[1]._M_nxt],
                                                  (AnimationSamplers *)(_Var15._M_nxt + 2));
                    paVar6->mMorphMeshChannels[iVar17] = paVar10;
                    iVar17 = iVar17 + 1;
                  }
                  _Var15._M_nxt = (_Var15._M_nxt)->_M_nxt;
                } while (_Var15._M_nxt != (_Hash_node_base *)0x0);
              }
            }
            if ((ulong)paVar6->mNumChannels == 0) {
              dVar18 = 0.0;
            }
            else {
              dVar18 = 0.0;
              uVar12 = 0;
              do {
                paVar8 = paVar6->mChannels[uVar12];
                dVar20 = dVar18;
                if ((paVar8->mNumPositionKeys != 0) &&
                   (dVar20 = paVar8->mPositionKeys[paVar8->mNumPositionKeys - 1].mTime,
                   dVar20 <= dVar18)) {
                  dVar20 = dVar18;
                }
                dVar19 = dVar20;
                if ((paVar8->mNumRotationKeys != 0) &&
                   (dVar19 = paVar8->mRotationKeys[paVar8->mNumRotationKeys - 1].mTime,
                   dVar19 <= dVar20)) {
                  dVar19 = dVar20;
                }
                dVar18 = dVar19;
                if ((paVar8->mNumScalingKeys != 0) &&
                   (dVar18 = paVar8->mScalingKeys[paVar8->mNumScalingKeys - 1].mTime,
                   dVar18 <= dVar19)) {
                  dVar18 = dVar19;
                }
                uVar12 = uVar12 + 1;
              } while (paVar6->mNumChannels != uVar12);
            }
            if ((ulong)paVar6->mNumMorphMeshChannels != 0) {
              uVar12 = 0;
              dVar20 = dVar18;
              do {
                uVar3 = paVar6->mMorphMeshChannels[uVar12]->mNumKeys;
                dVar18 = dVar20;
                if ((uVar3 != 0) &&
                   (dVar18 = paVar6->mMorphMeshChannels[uVar12]->mKeys[uVar3 - 1].mTime,
                   dVar18 <= dVar20)) {
                  dVar18 = dVar20;
                }
                uVar12 = uVar12 + 1;
                dVar20 = dVar18;
              } while (paVar6->mNumMorphMeshChannels != uVar12);
            }
          }
          paVar6->mDuration = dVar18;
          paVar6->mTicksPerSecond = 1000.0;
          this->mScene->mAnimations[uVar16] = paVar6;
          std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_AnimationSamplers>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&local_68);
          uVar16 = uVar16 + 1;
          ppAVar5 = (r->animations).mObjs.
                    super__Vector_base<glTF2::Animation_*,_std::allocator<glTF2::Animation_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar16 < ((ulong)((long)(r->animations).mObjs.
                                         super__Vector_base<glTF2::Animation_*,_std::allocator<glTF2::Animation_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar5)
                           >> 3 & 0xffffffff));
      }
    }
  }
  return;
}

Assistant:

void glTF2Importer::ImportAnimations(glTF2::Asset &r) {
	if (!r.scene) return;

	mScene->mNumAnimations = r.animations.Size();
	if (mScene->mNumAnimations == 0) {
		return;
	}

	mScene->mAnimations = new aiAnimation *[mScene->mNumAnimations];
	for (unsigned int i = 0; i < r.animations.Size(); ++i) {
		Animation &anim = r.animations[i];

		aiAnimation *ai_anim = new aiAnimation();
		ai_anim->mName = anim.name;
		ai_anim->mDuration = 0;
		ai_anim->mTicksPerSecond = 0;

		std::unordered_map<unsigned int, AnimationSamplers> samplers = GatherSamplers(anim);

		uint32_t numChannels = 0u;
		uint32_t numMorphMeshChannels = 0u;

		for (auto &iter : samplers) {
			if ((nullptr != iter.second.rotation) || (nullptr != iter.second.scale) || (nullptr != iter.second.translation)) {
				++numChannels;
			}
			if (nullptr != iter.second.weight) {
				++numMorphMeshChannels;
			}
		}

		ai_anim->mNumChannels = numChannels;
		if (ai_anim->mNumChannels > 0) {
			ai_anim->mChannels = new aiNodeAnim *[ai_anim->mNumChannels];
			int j = 0;
			for (auto &iter : samplers) {
				if ((nullptr != iter.second.rotation) || (nullptr != iter.second.scale) || (nullptr != iter.second.translation)) {
					ai_anim->mChannels[j] = CreateNodeAnim(r, r.nodes[iter.first], iter.second);
					++j;
				}
			}
		}

		ai_anim->mNumMorphMeshChannels = numMorphMeshChannels;
		if (ai_anim->mNumMorphMeshChannels > 0) {
			ai_anim->mMorphMeshChannels = new aiMeshMorphAnim *[ai_anim->mNumMorphMeshChannels];
			int j = 0;
			for (auto &iter : samplers) {
				if (nullptr != iter.second.weight) {
					ai_anim->mMorphMeshChannels[j] = CreateMeshMorphAnim(r, r.nodes[iter.first], iter.second);
					++j;
				}
			}
		}

		// Use the latest keyframe for the duration of the animation
		double maxDuration = 0;
		unsigned int maxNumberOfKeys = 0;
		for (unsigned int j = 0; j < ai_anim->mNumChannels; ++j) {
			auto chan = ai_anim->mChannels[j];
			if (chan->mNumPositionKeys) {
				auto lastPosKey = chan->mPositionKeys[chan->mNumPositionKeys - 1];
				if (lastPosKey.mTime > maxDuration) {
					maxDuration = lastPosKey.mTime;
				}
				maxNumberOfKeys = std::max(maxNumberOfKeys, chan->mNumPositionKeys);
			}
			if (chan->mNumRotationKeys) {
				auto lastRotKey = chan->mRotationKeys[chan->mNumRotationKeys - 1];
				if (lastRotKey.mTime > maxDuration) {
					maxDuration = lastRotKey.mTime;
				}
				maxNumberOfKeys = std::max(maxNumberOfKeys, chan->mNumRotationKeys);
			}
			if (chan->mNumScalingKeys) {
				auto lastScaleKey = chan->mScalingKeys[chan->mNumScalingKeys - 1];
				if (lastScaleKey.mTime > maxDuration) {
					maxDuration = lastScaleKey.mTime;
				}
				maxNumberOfKeys = std::max(maxNumberOfKeys, chan->mNumScalingKeys);
			}
		}

		for (unsigned int j = 0; j < ai_anim->mNumMorphMeshChannels; ++j) {
			const auto *const chan = ai_anim->mMorphMeshChannels[j];

			if (0u != chan->mNumKeys) {
				const auto &lastKey = chan->mKeys[chan->mNumKeys - 1u];
				if (lastKey.mTime > maxDuration) {
					maxDuration = lastKey.mTime;
				}
				maxNumberOfKeys = std::max(maxNumberOfKeys, chan->mNumKeys);
			}
		}

		ai_anim->mDuration = maxDuration;
		ai_anim->mTicksPerSecond = 1000.0;

		mScene->mAnimations[i] = ai_anim;
	}
}